

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV2MaterialBlock(Parser *this,Material *mat)

{
  byte bVar1;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> *this_00;
  aiColor3D *paVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Texture *map;
  long lVar6;
  ai_real *paVar7;
  uint uVar8;
  byte *pbVar9;
  byte *pbVar10;
  ai_real aVar11;
  uint iNumSubMaterials;
  ai_real f;
  int local_3b0;
  uint local_3ac;
  size_type local_3a8;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> *local_3a0;
  string local_398;
  Texture *local_378;
  Texture *local_370;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> *local_368;
  Texture *local_360;
  Texture *local_358;
  Texture *local_350;
  Texture *local_348;
  Texture *local_340;
  ai_real *local_338;
  ai_real *local_330;
  ai_real *local_328;
  aiColor3D *local_320;
  string *local_318;
  value_type local_310;
  
  local_3ac = 0;
  local_318 = &(mat->super_Material).mName;
  local_320 = &(mat->super_Material).mSpecular;
  local_328 = &(mat->super_Material).mTransparency;
  local_330 = &(mat->super_Material).mSpecularExponent;
  local_338 = &(mat->super_Material).mShininessStrength;
  local_340 = &(mat->super_Material).sTexDiffuse;
  local_348 = &(mat->super_Material).sTexAmbient;
  local_3a0 = &mat->avSubMaterials;
  local_368 = &local_310.avSubMaterials;
  local_358 = &(mat->super_Material).sTexSpecular;
  local_370 = &(mat->super_Material).sTexBump;
  local_378 = &(mat->super_Material).sTexShininess;
  local_360 = &(mat->super_Material).sTexEmissive;
  local_350 = &(mat->super_Material).sTexOpacity;
  local_3a8 = 0;
  local_3b0 = 0;
LAB_00400adb:
  while( true ) {
    pbVar10 = (byte *)this->filePtr;
    bVar1 = *pbVar10;
    if (bVar1 == 0x2a) break;
LAB_004013e6:
    bVar3 = false;
    if (bVar1 < 0x7b) {
      if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_0040142c;
        this->iLineNumber = this->iLineNumber + 1;
        bVar3 = true;
      }
      else if (bVar1 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a *MATERIAL chunk (Level 2)");
      }
    }
    else {
      if (bVar1 == 0x7d) {
        local_3b0 = local_3b0 + -1;
        if (local_3b0 == 0) {
          this->filePtr = (char *)(pbVar10 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else {
        if (bVar1 != 0x7b) goto LAB_0040142e;
        local_3b0 = local_3b0 + 1;
      }
LAB_0040142c:
      bVar3 = false;
    }
LAB_0040142e:
    this->bLastWasEndLine = bVar3;
    this->filePtr = (char *)(pbVar10 + 1);
  }
  pbVar9 = pbVar10 + 1;
  this->filePtr = (char *)pbVar9;
  iVar4 = strncmp("MATERIAL_NAME",(char *)pbVar9,0xd);
  if (iVar4 == 0) {
    bVar1 = pbVar10[0xe];
    if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_00400b0f;
    pbVar9 = pbVar10 + 0xf;
    if (bVar1 == 0) {
      pbVar9 = pbVar10 + 0xe;
    }
    this->filePtr = (char *)pbVar9;
    bVar3 = ParseString(this,local_318,"*MATERIAL_NAME");
    if (!bVar3) {
LAB_00400ce6:
      SkipToNextToken(this);
    }
    goto LAB_00400adb;
  }
LAB_00400b0f:
  iVar4 = strncmp("MATERIAL_AMBIENT",(char *)pbVar9,0x10);
  if (iVar4 == 0) {
    bVar1 = pbVar10[0x11];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pbVar9 = pbVar10 + 0x12;
      if (bVar1 == 0) {
        pbVar9 = pbVar10 + 0x11;
      }
      this->filePtr = (char *)pbVar9;
      lVar6 = 0;
      do {
        ParseLV4MeshFloat(this,(ai_real *)((long)&(mat->super_Material).mAmbient.r + lVar6));
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0xc);
      goto LAB_00400adb;
    }
  }
  iVar4 = strncmp("MATERIAL_DIFFUSE",(char *)pbVar9,0x10);
  if (iVar4 == 0) {
    bVar1 = pbVar10[0x11];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pbVar9 = pbVar10 + 0x12;
      if (bVar1 == 0) {
        pbVar9 = pbVar10 + 0x11;
      }
      this->filePtr = (char *)pbVar9;
      lVar6 = 0;
      do {
        ParseLV4MeshFloat(this,(ai_real *)((long)&(mat->super_Material).mDiffuse.r + lVar6));
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0xc);
      goto LAB_00400adb;
    }
  }
  iVar4 = strncmp("MATERIAL_SPECULAR",(char *)pbVar9,0x11);
  paVar2 = local_320;
  if (iVar4 == 0) {
    bVar1 = pbVar10[0x12];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pbVar9 = pbVar10 + 0x13;
      if (bVar1 == 0) {
        pbVar9 = pbVar10 + 0x12;
      }
      this->filePtr = (char *)pbVar9;
      lVar6 = 0;
      do {
        ParseLV4MeshFloat(this,(ai_real *)((long)&paVar2->r + lVar6));
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0xc);
      goto LAB_00400adb;
    }
  }
  iVar4 = strncmp("MATERIAL_SHADING",(char *)pbVar9,0x10);
  if (iVar4 == 0) {
    bVar1 = pbVar10[0x11];
    if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_00400b7f;
    pbVar9 = pbVar10 + 0x12;
    if (bVar1 == 0) {
      pbVar9 = pbVar10 + 0x11;
    }
    this->filePtr = (char *)pbVar9;
    iVar4 = strncmp("Blinn",(char *)pbVar9,5);
    if (iVar4 == 0) {
      bVar1 = pbVar9[5];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pbVar10 = pbVar9 + 6;
        if (bVar1 == 0) {
          pbVar10 = pbVar9 + 5;
        }
        this->filePtr = (char *)pbVar10;
        (mat->super_Material).mShading = Blinn;
        goto LAB_00400adb;
      }
    }
    iVar4 = strncmp("Phong",(char *)pbVar9,5);
    if (iVar4 == 0) {
      bVar1 = pbVar9[5];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pbVar10 = pbVar9 + 6;
        if (bVar1 == 0) {
          pbVar10 = pbVar9 + 5;
        }
        this->filePtr = (char *)pbVar10;
        (mat->super_Material).mShading = Phong;
        goto LAB_00400adb;
      }
    }
    iVar4 = strncmp("Flat",(char *)pbVar9,4);
    if (iVar4 == 0) {
      bVar1 = pbVar9[4];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pbVar10 = pbVar9 + 5;
        if (bVar1 == 0) {
          pbVar10 = pbVar9 + 4;
        }
        this->filePtr = (char *)pbVar10;
        (mat->super_Material).mShading = Flat;
        goto LAB_00400adb;
      }
    }
    iVar4 = strncmp("Wire",(char *)pbVar9,4);
    if (iVar4 == 0) {
      bVar1 = pbVar9[4];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pbVar10 = pbVar9 + 5;
        if (bVar1 == 0) {
          pbVar10 = pbVar9 + 4;
        }
        this->filePtr = (char *)pbVar10;
        (mat->super_Material).mShading = Wire;
        goto LAB_00400adb;
      }
    }
    (mat->super_Material).mShading = Gouraud;
    goto LAB_00400ce6;
  }
LAB_00400b7f:
  iVar4 = strncmp("MATERIAL_TRANSPARENCY",(char *)pbVar9,0x15);
  paVar7 = local_328;
  if (iVar4 == 0) {
    bVar1 = pbVar10[0x16];
    if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_00400b9b;
    pbVar9 = pbVar10 + 0x17;
    if (bVar1 == 0) {
      pbVar9 = pbVar10 + 0x16;
    }
    this->filePtr = (char *)pbVar9;
    ParseLV4MeshFloat(this,local_328);
    aVar11 = 1.0 - *paVar7;
LAB_0040100d:
    *paVar7 = aVar11;
    goto LAB_00400adb;
  }
LAB_00400b9b:
  iVar4 = strncmp("MATERIAL_SELFILLUM",(char *)pbVar9,0x12);
  if (iVar4 == 0) {
    bVar1 = pbVar10[0x13];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pbVar9 = pbVar10 + 0x14;
      if (bVar1 == 0) {
        pbVar9 = pbVar10 + 0x13;
      }
      this->filePtr = (char *)pbVar9;
      local_310.super_Material._vptr_Material =
           (_func_int **)((ulong)local_310.super_Material._vptr_Material & 0xffffffff00000000);
      ParseLV4MeshFloat(this,(ai_real *)&local_310);
      (mat->super_Material).mEmissive.r = local_310.super_Material._vptr_Material._0_4_;
      (mat->super_Material).mEmissive.g = local_310.super_Material._vptr_Material._0_4_;
      (mat->super_Material).mEmissive.b = local_310.super_Material._vptr_Material._0_4_;
      goto LAB_00400adb;
    }
  }
  iVar4 = strncmp("MATERIAL_SHINE",(char *)pbVar9,0xe);
  paVar7 = local_330;
  if (iVar4 == 0) {
    bVar1 = pbVar10[0xf];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pbVar9 = pbVar10 + 0x10;
      if (bVar1 == 0) {
        pbVar9 = pbVar10 + 0xf;
      }
      this->filePtr = (char *)pbVar9;
      ParseLV4MeshFloat(this,local_330);
      aVar11 = *paVar7 * 15.0;
      goto LAB_0040100d;
    }
  }
  iVar4 = strncmp("MATERIAL_TWOSIDED",(char *)pbVar9,0x11);
  if (iVar4 == 0) {
    bVar1 = pbVar10[0x12];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pbVar9 = pbVar10 + 0x13;
      if (bVar1 == 0) {
        pbVar9 = pbVar10 + 0x12;
      }
      this->filePtr = (char *)pbVar9;
      (mat->super_Material).mTwoSided = true;
      goto LAB_00400adb;
    }
  }
  iVar4 = strncmp("MATERIAL_SHINESTRENGTH",(char *)pbVar9,0x16);
  if (iVar4 == 0) {
    bVar1 = pbVar10[0x17];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pbVar9 = pbVar10 + 0x18;
      if (bVar1 == 0) {
        pbVar9 = pbVar10 + 0x17;
      }
      this->filePtr = (char *)pbVar9;
      ParseLV4MeshFloat(this,local_338);
      goto LAB_00400adb;
    }
  }
  iVar4 = strncmp("MAP_DIFFUSE",(char *)pbVar9,0xb);
  if (iVar4 == 0) {
    bVar1 = pbVar10[0xc];
    if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_00400c27;
    pbVar9 = pbVar10 + 0xd;
    if (bVar1 == 0) {
      pbVar9 = pbVar10 + 0xc;
    }
    this->filePtr = (char *)pbVar9;
    map = local_340;
LAB_0040122b:
    ParseLV3MapBlock(this,map);
  }
  else {
LAB_00400c27:
    iVar4 = strncmp("MAP_AMBIENT",(char *)pbVar9,0xb);
    if (iVar4 == 0) {
      bVar1 = pbVar10[0xc];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pbVar9 = pbVar10 + 0xd;
        if (bVar1 == 0) {
          pbVar9 = pbVar10 + 0xc;
        }
        this->filePtr = (char *)pbVar9;
        map = local_348;
        goto LAB_0040122b;
      }
    }
    iVar4 = strncmp("MAP_SPECULAR",(char *)pbVar9,0xc);
    if (iVar4 == 0) {
      bVar1 = pbVar10[0xd];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pbVar9 = pbVar10 + 0xe;
        if (bVar1 == 0) {
          pbVar9 = pbVar10 + 0xd;
        }
        this->filePtr = (char *)pbVar9;
        map = local_358;
        goto LAB_0040122b;
      }
    }
    bVar3 = TokenMatch<char_const>(&this->filePtr,"MAP_OPACITY",0xb);
    if (bVar3) {
      ParseLV3MapBlock(this,local_350);
    }
    else {
      bVar3 = TokenMatch<char_const>(&this->filePtr,"MAP_SELFILLUM",0xd);
      if (bVar3) {
        ParseLV3MapBlock(this,local_360);
      }
      else {
        bVar3 = TokenMatch<char_const>(&this->filePtr,"MAP_BUMP",8);
        if (bVar3) {
          ParseLV3MapBlock(this,local_370);
        }
        bVar3 = TokenMatch<char_const>(&this->filePtr,"MAP_SHINESTRENGTH",0x11);
        if (bVar3) {
          ParseLV3MapBlock(this,local_378);
        }
        else {
          bVar3 = TokenMatch<char_const>(&this->filePtr,"NUMSUBMTLS",10);
          this_00 = local_368;
          if (bVar3) {
            ParseLV4MeshLong(this,&local_3ac);
            local_3a8 = (size_type)local_3ac;
            local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_398,"INVALID SUBMATERIAL","");
            D3DS::Material::Material(&local_310.super_Material,&local_398);
            local_310.super_Material._vptr_Material = (_func_int **)&PTR__Material_0080e978;
            (this_00->
            super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            *(aiMaterial **)(this_00 + 1) = (aiMaterial *)0x0;
            (this_00->
            super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>).
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (this_00->
            super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>).
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            *(bool *)((long)(this_00 + 1) + 8) = false;
            std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::resize
                      (local_3a0,local_3a8,&local_310);
            local_310.super_Material._vptr_Material = (_func_int **)&PTR__Material_0080e978;
            std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::~vector
                      (this_00);
            D3DS::Material::~Material(&local_310.super_Material);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_dataplus._M_p != &local_398.field_2) {
              operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar3 = TokenMatch<char_const>(&this->filePtr,"SUBMATERIAL",0xb);
          if (!bVar3) {
            pbVar10 = (byte *)this->filePtr;
            bVar1 = *pbVar10;
            goto LAB_004013e6;
          }
          local_310.super_Material._vptr_Material =
               (_func_int **)((ulong)local_310.super_Material._vptr_Material & 0xffffffff00000000);
          ParseLV4MeshLong(this,(uint *)&local_310);
          uVar8 = (uint)local_3a8;
          uVar5 = (uint)local_310.super_Material._vptr_Material._0_4_;
          if (uVar8 <= (uint)local_310.super_Material._vptr_Material._0_4_) {
            LogWarning(this,"Out of range: submaterial index is too large");
            uVar5 = uVar8 - 1;
          }
          ParseLV2MaterialBlock
                    (this,(local_3a0->
                          super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar5);
        }
      }
    }
  }
  goto LAB_00400adb;
}

Assistant:

void Parser::ParseLV2MaterialBlock(ASE::Material& mat)
{
    AI_ASE_PARSER_INIT();

    unsigned int iNumSubMaterials = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"MATERIAL_NAME",13))
            {
                if (!ParseString(mat.mName,"*MATERIAL_NAME"))
                    SkipToNextToken();
                continue;
            }
            // ambient material color
            if (TokenMatch(filePtr,"MATERIAL_AMBIENT",16))
            {
                ParseLV4MeshFloatTriple(&mat.mAmbient.r);
                continue;
            }
            // diffuse material color
            if (TokenMatch(filePtr,"MATERIAL_DIFFUSE",16) )
            {
                ParseLV4MeshFloatTriple(&mat.mDiffuse.r);
                continue;
            }
            // specular material color
            if (TokenMatch(filePtr,"MATERIAL_SPECULAR",17))
            {
                ParseLV4MeshFloatTriple(&mat.mSpecular.r);
                continue;
            }
            // material shading type
            if (TokenMatch(filePtr,"MATERIAL_SHADING",16))
            {
                if (TokenMatch(filePtr,"Blinn",5))
                {
                    mat.mShading = Discreet3DS::Blinn;
                }
                else if (TokenMatch(filePtr,"Phong",5))
                {
                    mat.mShading = Discreet3DS::Phong;
                }
                else if (TokenMatch(filePtr,"Flat",4))
                {
                    mat.mShading = Discreet3DS::Flat;
                }
                else if (TokenMatch(filePtr,"Wire",4))
                {
                    mat.mShading = Discreet3DS::Wire;
                }
                else
                {
                    // assume gouraud shading
                    mat.mShading = Discreet3DS::Gouraud;
                    SkipToNextToken();
                }
                continue;
            }
            // material transparency
            if (TokenMatch(filePtr,"MATERIAL_TRANSPARENCY",21))
            {
                ParseLV4MeshFloat(mat.mTransparency);
                mat.mTransparency = ai_real( 1.0 ) - mat.mTransparency;
                continue;
            }
            // material self illumination
            if (TokenMatch(filePtr,"MATERIAL_SELFILLUM",18))
            {
                ai_real f = 0.0;
                ParseLV4MeshFloat(f);

                mat.mEmissive.r = f;
                mat.mEmissive.g = f;
                mat.mEmissive.b = f;
                continue;
            }
            // material shininess
            if (TokenMatch(filePtr,"MATERIAL_SHINE",14) )
            {
                ParseLV4MeshFloat(mat.mSpecularExponent);
                mat.mSpecularExponent *= 15;
                continue;
            }
            // two-sided material
            if (TokenMatch(filePtr,"MATERIAL_TWOSIDED",17) )
            {
                mat.mTwoSided = true;
                continue;
            }
            // material shininess strength
            if (TokenMatch(filePtr,"MATERIAL_SHINESTRENGTH",22))
            {
                ParseLV4MeshFloat(mat.mShininessStrength);
                continue;
            }
            // diffuse color map
            if (TokenMatch(filePtr,"MAP_DIFFUSE",11))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexDiffuse);
                continue;
            }
            // ambient color map
            if (TokenMatch(filePtr,"MAP_AMBIENT",11))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexAmbient);
                continue;
            }
            // specular color map
            if (TokenMatch(filePtr,"MAP_SPECULAR",12))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexSpecular);
                continue;
            }
            // opacity map
            if (TokenMatch(filePtr,"MAP_OPACITY",11))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexOpacity);
                continue;
            }
            // emissive map
            if (TokenMatch(filePtr,"MAP_SELFILLUM",13))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexEmissive);
                continue;
            }
            // bump map
            if (TokenMatch(filePtr,"MAP_BUMP",8))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexBump);
            }
            // specular/shininess map
            if (TokenMatch(filePtr,"MAP_SHINESTRENGTH",17))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexShininess);
                continue;
            }
            // number of submaterials
            if (TokenMatch(filePtr,"NUMSUBMTLS",10))
            {
                ParseLV4MeshLong(iNumSubMaterials);

                // allocate enough storage
                mat.avSubMaterials.resize(iNumSubMaterials, Material("INVALID SUBMATERIAL"));
            }
            // submaterial chunks
            if (TokenMatch(filePtr,"SUBMATERIAL",11))
            {

                unsigned int iIndex = 0;
                ParseLV4MeshLong(iIndex);

                if (iIndex >= iNumSubMaterials)
                {
                    LogWarning("Out of range: submaterial index is too large");
                    iIndex = iNumSubMaterials-1;
                }

                // get a reference to the material
                Material& sMat = mat.avSubMaterials[iIndex];

                // parse the material block
                ParseLV2MaterialBlock(sMat);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","*MATERIAL");
    }
}